

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O0

void iterator_seek_wal_only_test(void)

{
  fdb_kvs_handle *handle;
  int iVar1;
  fdb_status fVar2;
  size_t sVar3;
  size_t end_keylen;
  void *pvVar4;
  undefined7 in_stack_fffffffffffffa28;
  fdb_iterator_seek_opt_t in_stack_fffffffffffffa2f;
  fdb_file_handle *in_stack_fffffffffffffa30;
  fdb_iterator *in_stack_fffffffffffffa38;
  fdb_iterator *in_stack_fffffffffffffa40;
  size_t in_stack_fffffffffffffa50;
  fdb_doc **in_stack_fffffffffffffaa0;
  fdb_doc **doc_00;
  fdb_iterator *in_stack_fffffffffffffaa8;
  fdb_iterator *iterator_00;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_iterator *local_a0;
  fdb_iterator *iterator;
  size_t *psStack_90;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_handle *kv1;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int local_60;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  dbfile._4_4_ = 10;
  rdoc = (fdb_doc *)&stack0xfffffffffffffa28;
  psStack_90 = (size_t *)0x0;
  local_60 = system("rm -rf  iterator_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  fdb_open((fdb_file_handle **)fconfig._240_8_,(char *)fconfig._232_8_,
           (fdb_config *)fconfig.log_msg_level);
  fdb_kvs_open_default
            (in_stack_fffffffffffffa30,
             (fdb_kvs_handle **)CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28),
             (fdb_kvs_config *)0x11985d);
  iterator._4_4_ = fdb_set_log_callback(kv1,logCallbackFunc,"iterator_seek_wal_only_test");
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc3c);
    iterator_seek_wal_only_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xc3c,"void iterator_seek_wal_only_test()");
    }
  }
  iterator._4_4_ =
       fdb_kvs_open((fdb_file_handle *)fconfig._128_8_,
                    (fdb_kvs_handle **)fconfig.num_compactor_threads,
                    (char *)fconfig.max_writer_lock_prob,(fdb_kvs_config *)fconfig.compaction_cb_ctx
                   );
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc40);
    iterator_seek_wal_only_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xc40,"void iterator_seek_wal_only_test()");
    }
  }
  for (n = 0; n < dbfile._4_4_; n = n + 1) {
    sprintf(metabuf + 0xf8,"kEy%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"mEta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"bOdy%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar4 = (void *)0x119a2e;
    sVar3 = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
                   CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28),pvVar4,sVar3,
                   (void *)0x119a65,in_stack_fffffffffffffa50);
    iterator._4_4_ = fdb_set((fdb_kvs_handle *)doc,(fdb_doc *)(&rdoc->keylen)[n]);
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xc4a);
      iterator_seek_wal_only_test::__test_pass = 0;
      if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xc4a,"void iterator_seek_wal_only_test()");
      }
    }
    fdb_doc_free((fdb_doc *)0x119af8);
  }
  for (n = 0; n < dbfile._4_4_; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar4 = (void *)0x119bd3;
    sVar3 = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
                   CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28),pvVar4,sVar3,
                   (void *)0x119c0a,in_stack_fffffffffffffa50);
    fdb_set(kv1,(fdb_doc *)(&rdoc->keylen)[n]);
  }
  fdb_commit((fdb_file_handle *)CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28),'\0');
  fdb_iterator_init(kv1,&local_a0,(void *)0x0,0,(void *)0x0,0,0);
  iterator._4_4_ = fdb_iterator_get(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc5f);
    iterator_seek_wal_only_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xc5f,"void iterator_seek_wal_only_test()");
    }
  }
  iVar1 = memcmp((void *)psStack_90[4],*(void **)(rdoc->keylen + 0x20),*psStack_90);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)(rdoc->keylen + 0x20),psStack_90[4],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc61);
    iterator_seek_wal_only_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc61,"void iterator_seek_wal_only_test()");
  }
  iVar1 = memcmp((void *)psStack_90[7],*(void **)(rdoc->keylen + 0x38),psStack_90[1]);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)(rdoc->keylen + 0x38),psStack_90[7],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc62);
    iterator_seek_wal_only_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc62,"void iterator_seek_wal_only_test()");
  }
  iVar1 = memcmp((void *)psStack_90[8],*(void **)(rdoc->keylen + 0x40),psStack_90[2]);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)(rdoc->keylen + 0x40),psStack_90[8],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc63);
    iterator_seek_wal_only_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc63,"void iterator_seek_wal_only_test()");
  }
  fdb_doc_free((fdb_doc *)0x119e9f);
  psStack_90 = (size_t *)0x0;
  n = 2;
  strlen(metabuf + 0xf8);
  iterator._4_4_ =
       fdb_iterator_seek(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                         (size_t)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2f);
  if (iterator._4_4_ == FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc6a);
    iterator_seek_wal_only_test::__test_pass = 0;
    if (iterator._4_4_ == FDB_RESULT_ITERATOR_FAIL) {
      __assert_fail("status != FDB_RESULT_ITERATOR_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xc6a,"void iterator_seek_wal_only_test()");
    }
  }
  iterator._4_4_ = fdb_iterator_get(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc6c);
    iterator_seek_wal_only_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xc6c,"void iterator_seek_wal_only_test()");
    }
  }
  iVar1 = memcmp((void *)psStack_90[4],*(void **)((&rdoc->keylen)[n] + 0x20),*psStack_90);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x20),psStack_90[4],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc6e);
    iterator_seek_wal_only_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc6e,"void iterator_seek_wal_only_test()");
  }
  iVar1 = memcmp((void *)psStack_90[7],*(void **)((&rdoc->keylen)[n] + 0x38),psStack_90[1]);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x38),psStack_90[7],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc6f);
    iterator_seek_wal_only_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc6f,"void iterator_seek_wal_only_test()");
  }
  iVar1 = memcmp((void *)psStack_90[8],*(void **)((&rdoc->keylen)[n] + 0x40),psStack_90[2]);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x40),psStack_90[8],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc70);
    iterator_seek_wal_only_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc70,"void iterator_seek_wal_only_test()");
  }
  fdb_doc_free((fdb_doc *)0x11a1b5);
  psStack_90 = (size_t *)0x0;
  iterator._4_4_ =
       fdb_iterator_next((fdb_iterator *)
                         CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28));
  if (iterator._4_4_ == FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc76);
    iterator_seek_wal_only_test::__test_pass = 0;
    if (iterator._4_4_ == FDB_RESULT_ITERATOR_FAIL) {
      __assert_fail("status != FDB_RESULT_ITERATOR_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xc76,"void iterator_seek_wal_only_test()");
    }
  }
  iterator._4_4_ = fdb_iterator_get(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc78);
    iterator_seek_wal_only_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xc78,"void iterator_seek_wal_only_test()");
    }
  }
  n = n + 1;
  iVar1 = memcmp((void *)psStack_90[4],*(void **)((&rdoc->keylen)[n] + 0x20),*psStack_90);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x20),psStack_90[4],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc7b);
    iterator_seek_wal_only_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc7b,"void iterator_seek_wal_only_test()");
  }
  iVar1 = memcmp((void *)psStack_90[7],*(void **)((&rdoc->keylen)[n] + 0x38),psStack_90[1]);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x38),psStack_90[7],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc7c);
    iterator_seek_wal_only_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc7c,"void iterator_seek_wal_only_test()");
  }
  iVar1 = memcmp((void *)psStack_90[8],*(void **)((&rdoc->keylen)[n] + 0x40),psStack_90[2]);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x40),psStack_90[8],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc7d);
    iterator_seek_wal_only_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc7d,"void iterator_seek_wal_only_test()");
  }
  fdb_doc_free((fdb_doc *)0x11a490);
  psStack_90 = (size_t *)0x0;
  strlen(metabuf + 0xf8);
  iterator._4_4_ =
       fdb_iterator_seek(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                         (size_t)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2f);
  if (iterator._4_4_ == FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc83);
    iterator_seek_wal_only_test::__test_pass = 0;
    if (iterator._4_4_ == FDB_RESULT_ITERATOR_FAIL) {
      __assert_fail("status != FDB_RESULT_ITERATOR_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xc83,"void iterator_seek_wal_only_test()");
    }
  }
  iterator._4_4_ = fdb_iterator_get(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc85);
    iterator_seek_wal_only_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xc85,"void iterator_seek_wal_only_test()");
    }
  }
  iVar1 = memcmp((void *)psStack_90[4],*(void **)((&rdoc->keylen)[dbfile._4_4_ + -1] + 0x20),
                 *psStack_90);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[dbfile._4_4_ + -1] + 0x20),psStack_90[4],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc87);
    iterator_seek_wal_only_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc87,"void iterator_seek_wal_only_test()");
  }
  iVar1 = memcmp((void *)psStack_90[7],*(void **)((&rdoc->keylen)[dbfile._4_4_ + -1] + 0x38),
                 psStack_90[1]);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[dbfile._4_4_ + -1] + 0x38),psStack_90[7],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc88);
    iterator_seek_wal_only_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc88,"void iterator_seek_wal_only_test()");
  }
  iVar1 = memcmp((void *)psStack_90[8],*(void **)((&rdoc->keylen)[dbfile._4_4_ + -1] + 0x40),
                 psStack_90[2]);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[dbfile._4_4_ + -1] + 0x40),psStack_90[8],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc89);
    iterator_seek_wal_only_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc89,"void iterator_seek_wal_only_test()");
  }
  fdb_doc_free((fdb_doc *)0x11a7c2);
  psStack_90 = (size_t *)0x0;
  n = 0;
  strlen(metabuf + 0xf8);
  iterator._4_4_ =
       fdb_iterator_seek(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                         (size_t)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2f);
  if (iterator._4_4_ == FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc90);
    iterator_seek_wal_only_test::__test_pass = 0;
    if (iterator._4_4_ == FDB_RESULT_ITERATOR_FAIL) {
      __assert_fail("status != FDB_RESULT_ITERATOR_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xc90,"void iterator_seek_wal_only_test()");
    }
  }
  iterator._4_4_ = fdb_iterator_get(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc92);
    iterator_seek_wal_only_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xc92,"void iterator_seek_wal_only_test()");
    }
  }
  iVar1 = memcmp((void *)psStack_90[4],*(void **)((&rdoc->keylen)[n] + 0x20),*psStack_90);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x20),psStack_90[4],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc94);
    iterator_seek_wal_only_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc94,"void iterator_seek_wal_only_test()");
  }
  iVar1 = memcmp((void *)psStack_90[7],*(void **)((&rdoc->keylen)[n] + 0x38),psStack_90[1]);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x38),psStack_90[7],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc95);
    iterator_seek_wal_only_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc95,"void iterator_seek_wal_only_test()");
  }
  iVar1 = memcmp((void *)psStack_90[8],*(void **)((&rdoc->keylen)[n] + 0x40),psStack_90[2]);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x40),psStack_90[8],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc96);
    iterator_seek_wal_only_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc96,"void iterator_seek_wal_only_test()");
  }
  fdb_doc_free((fdb_doc *)0x11aad8);
  psStack_90 = (size_t *)0x0;
  strlen(metabuf + 0xf8);
  iterator._4_4_ =
       fdb_iterator_seek(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                         (size_t)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2f);
  iterator_00 = local_a0;
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc9c);
    iterator_seek_wal_only_test::__test_pass = 0;
    iterator_00 = local_a0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xc9c,"void iterator_seek_wal_only_test()");
    }
  }
  n = 2;
  do {
    iterator._4_4_ = fdb_iterator_get(iterator_00,in_stack_fffffffffffffaa0);
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xca1);
      iterator_seek_wal_only_test::__test_pass = 0;
      if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xca1,"void iterator_seek_wal_only_test()");
      }
    }
    iVar1 = memcmp((void *)psStack_90[4],*(void **)((&rdoc->keylen)[n] + 0x20),*psStack_90);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)((&rdoc->keylen)[n] + 0x20),psStack_90[4],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xca3);
      iterator_seek_wal_only_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xca3,"void iterator_seek_wal_only_test()");
    }
    iVar1 = memcmp((void *)psStack_90[7],*(void **)((&rdoc->keylen)[n] + 0x38),psStack_90[1]);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)((&rdoc->keylen)[n] + 0x38),psStack_90[7],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xca4);
      iterator_seek_wal_only_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xca4,"void iterator_seek_wal_only_test()");
    }
    iVar1 = memcmp((void *)psStack_90[8],*(void **)((&rdoc->keylen)[n] + 0x40),psStack_90[2]);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)((&rdoc->keylen)[n] + 0x40),psStack_90[8],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xca5);
      iterator_seek_wal_only_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xca5,"void iterator_seek_wal_only_test()");
    }
    fdb_doc_free((fdb_doc *)0x11adea);
    psStack_90 = (size_t *)0x0;
    n = n + 1;
    fVar2 = fdb_iterator_next((fdb_iterator *)
                              CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28));
  } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
  if (n != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xcab);
    iterator_seek_wal_only_test::__test_pass = 0;
    if (n != 10) {
      __assert_fail("i==10",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcab,"void iterator_seek_wal_only_test()");
    }
  }
  doc_00 = *(fdb_doc ***)(rdoc->size_ondisk + 0x20);
  strlen(metabuf + 0xf8);
  iterator._4_4_ =
       fdb_iterator_seek(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                         (size_t)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2f);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xcaf);
    iterator_seek_wal_only_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcaf,"void iterator_seek_wal_only_test()");
    }
  }
  n = 3;
  do {
    iterator._4_4_ = fdb_iterator_get(iterator_00,doc_00);
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcb4);
      iterator_seek_wal_only_test::__test_pass = 0;
      if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xcb4,"void iterator_seek_wal_only_test()");
      }
    }
    iVar1 = memcmp((void *)psStack_90[4],*(void **)((&rdoc->keylen)[n] + 0x20),*psStack_90);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)((&rdoc->keylen)[n] + 0x20),psStack_90[4],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcb6);
      iterator_seek_wal_only_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcb6,"void iterator_seek_wal_only_test()");
    }
    iVar1 = memcmp((void *)psStack_90[7],*(void **)((&rdoc->keylen)[n] + 0x38),psStack_90[1]);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)((&rdoc->keylen)[n] + 0x38),psStack_90[7],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcb7);
      iterator_seek_wal_only_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcb7,"void iterator_seek_wal_only_test()");
    }
    iVar1 = memcmp((void *)psStack_90[8],*(void **)((&rdoc->keylen)[n] + 0x40),psStack_90[2]);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)((&rdoc->keylen)[n] + 0x40),psStack_90[8],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcb8);
      iterator_seek_wal_only_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcb8,"void iterator_seek_wal_only_test()");
    }
    fdb_doc_free((fdb_doc *)0x11b177);
    psStack_90 = (size_t *)0x0;
    n = n + 1;
    fVar2 = fdb_iterator_next((fdb_iterator *)
                              CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28));
  } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
  if (n != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xcbe);
    iterator_seek_wal_only_test::__test_pass = 0;
    if (n != 10) {
      __assert_fail("i==10",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcbe,"void iterator_seek_wal_only_test()");
    }
  }
  fdb_iterator_close(in_stack_fffffffffffffa38);
  sprintf(metabuf + 0xf8,"key%d",4);
  sprintf(bodybuf + 0xf8,"key%d",8);
  handle = kv1;
  sVar3 = strlen(metabuf + 0xf8);
  end_keylen = strlen(bodybuf + 0xf8);
  iterator._4_4_ =
       fdb_iterator_init(handle,&local_a0,metabuf + 0xf8,sVar3,bodybuf + 0xf8,end_keylen,2);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xcc9);
    iterator_seek_wal_only_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcc9,"void iterator_seek_wal_only_test()");
    }
  }
  n = 8;
  iterator._4_4_ =
       fdb_iterator_seek_to_max
                 ((fdb_iterator *)CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28));
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xccc);
    iterator_seek_wal_only_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xccc,"void iterator_seek_wal_only_test()");
    }
  }
  iterator._4_4_ = fdb_iterator_get(iterator_00,doc_00);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xcce);
    iterator_seek_wal_only_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcce,"void iterator_seek_wal_only_test()");
    }
  }
  iVar1 = memcmp((void *)psStack_90[4],*(void **)((&rdoc->keylen)[n] + 0x20),*psStack_90);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x20),psStack_90[4],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xcd0);
    iterator_seek_wal_only_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xcd0,"void iterator_seek_wal_only_test()");
  }
  iVar1 = memcmp((void *)psStack_90[7],*(void **)((&rdoc->keylen)[n] + 0x38),psStack_90[1]);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x38),psStack_90[7],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xcd1);
    iterator_seek_wal_only_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xcd1,"void iterator_seek_wal_only_test()");
  }
  iVar1 = memcmp((void *)psStack_90[8],*(void **)((&rdoc->keylen)[n] + 0x40),psStack_90[2]);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x40),psStack_90[8],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xcd2);
    iterator_seek_wal_only_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xcd2,"void iterator_seek_wal_only_test()");
  }
  fdb_doc_free((fdb_doc *)0x11b5f4);
  psStack_90 = (size_t *)0x0;
  n = 4;
  iterator._4_4_ =
       fdb_iterator_seek_to_min
                 ((fdb_iterator *)CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28));
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xcd9);
    iterator_seek_wal_only_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcd9,"void iterator_seek_wal_only_test()");
    }
  }
  iterator._4_4_ = fdb_iterator_get(iterator_00,doc_00);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xcdb);
    iterator_seek_wal_only_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcdb,"void iterator_seek_wal_only_test()");
    }
  }
  iVar1 = memcmp((void *)psStack_90[4],*(void **)((&rdoc->keylen)[n] + 0x20),*psStack_90);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x20),psStack_90[4],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xcdd);
    iterator_seek_wal_only_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xcdd,"void iterator_seek_wal_only_test()");
  }
  iVar1 = memcmp((void *)psStack_90[7],*(void **)((&rdoc->keylen)[n] + 0x38),psStack_90[1]);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x38),psStack_90[7],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xcde);
    iterator_seek_wal_only_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xcde,"void iterator_seek_wal_only_test()");
  }
  iVar1 = memcmp((void *)psStack_90[8],*(void **)((&rdoc->keylen)[n] + 0x40),psStack_90[2]);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x40),psStack_90[8],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xcdf);
    iterator_seek_wal_only_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xcdf,"void iterator_seek_wal_only_test()");
  }
  fdb_doc_free((fdb_doc *)0x11b8cd);
  psStack_90 = (size_t *)0x0;
  iterator._4_4_ = fdb_iterator_close(in_stack_fffffffffffffa38);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xce4);
    iterator_seek_wal_only_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xce4,"void iterator_seek_wal_only_test()");
    }
  }
  iterator._4_4_ = fdb_iterator_init(kv1,&local_a0,(void *)0x0,0,(void *)0x0,0,0);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xce8);
    iterator_seek_wal_only_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xce8,"void iterator_seek_wal_only_test()");
    }
  }
  n = dbfile._4_4_ + -1;
  iterator._4_4_ =
       fdb_iterator_seek_to_max
                 ((fdb_iterator *)CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28));
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xcec);
    iterator_seek_wal_only_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcec,"void iterator_seek_wal_only_test()");
    }
  }
  iterator._4_4_ = fdb_iterator_get(iterator_00,doc_00);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xcee);
    iterator_seek_wal_only_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcee,"void iterator_seek_wal_only_test()");
    }
  }
  iVar1 = memcmp((void *)psStack_90[4],*(void **)((&rdoc->keylen)[n] + 0x20),*psStack_90);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x20),psStack_90[4],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xcf0);
    iterator_seek_wal_only_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xcf0,"void iterator_seek_wal_only_test()");
  }
  iVar1 = memcmp((void *)psStack_90[7],*(void **)((&rdoc->keylen)[n] + 0x38),psStack_90[1]);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x38),psStack_90[7],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xcf1);
    iterator_seek_wal_only_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xcf1,"void iterator_seek_wal_only_test()");
  }
  iVar1 = memcmp((void *)psStack_90[8],*(void **)((&rdoc->keylen)[n] + 0x40),psStack_90[2]);
  if (iVar1 == 0) {
    fdb_doc_free((fdb_doc *)0x11bcb5);
    psStack_90 = (size_t *)0x0;
    n = 0;
    iterator._4_4_ =
         fdb_iterator_seek_to_min
                   ((fdb_iterator *)CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28));
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcf9);
      iterator_seek_wal_only_test::__test_pass = 0;
      if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xcf9,"void iterator_seek_wal_only_test()");
      }
    }
    iterator._4_4_ = fdb_iterator_get(iterator_00,doc_00);
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcfb);
      iterator_seek_wal_only_test::__test_pass = 0;
      if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xcfb,"void iterator_seek_wal_only_test()");
      }
    }
    iVar1 = memcmp((void *)psStack_90[4],*(void **)((&rdoc->keylen)[n] + 0x20),*psStack_90);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)((&rdoc->keylen)[n] + 0x20),psStack_90[4],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcfd);
      iterator_seek_wal_only_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcfd,"void iterator_seek_wal_only_test()");
    }
    iVar1 = memcmp((void *)psStack_90[7],*(void **)((&rdoc->keylen)[n] + 0x38),psStack_90[1]);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)((&rdoc->keylen)[n] + 0x38),psStack_90[7],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcfe);
      iterator_seek_wal_only_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcfe,"void iterator_seek_wal_only_test()");
    }
    iVar1 = memcmp((void *)psStack_90[8],*(void **)((&rdoc->keylen)[n] + 0x40),psStack_90[2]);
    if (iVar1 == 0) {
      fdb_doc_free((fdb_doc *)0x11bf8e);
      psStack_90 = (size_t *)0x0;
      iterator._4_4_ = fdb_iterator_close(in_stack_fffffffffffffa38);
      if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xd04);
        iterator_seek_wal_only_test::__test_pass = 0;
        if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                        ,0xd04,"void iterator_seek_wal_only_test()");
        }
      }
      fdb_kvs_close((fdb_kvs_handle *)CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28))
      ;
      fdb_kvs_close((fdb_kvs_handle *)CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28))
      ;
      fdb_close((fdb_file_handle *)CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28));
      for (n = 0; n < dbfile._4_4_; n = n + 1) {
        fdb_doc_free((fdb_doc *)0x11c049);
      }
      fdb_shutdown();
      memleak_end();
      if (iterator_seek_wal_only_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","iterator seek wal only test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","iterator seek wal only test");
      }
      return;
    }
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x40),psStack_90[8],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xcff);
    iterator_seek_wal_only_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xcff,"void iterator_seek_wal_only_test()");
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
          *(undefined8 *)((&rdoc->keylen)[n] + 0x40),psStack_90[8],
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
          ,0xcf2);
  iterator_seek_wal_only_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xcf2,"void iterator_seek_wal_only_test()");
}

Assistant:

void iterator_seek_wal_only_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *kv1;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "iterator_seek_wal_only_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Create another KV store..
    status = fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert using 'kv1' instance to ensure it does not interfere
    for (i=0;i<n;++i){
        sprintf(keybuf, "kEy%d", i);
        sprintf(metabuf, "mEta%d", i);
        sprintf(bodybuf, "bOdy%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        status = fdb_set(kv1, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc[i]);
    }

    // insert all documents into WAL only
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // commit without WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // create an iterator for full range
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);

    // seek current iterator to inside the WAL's avl tree..
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[0]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[0]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[0]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek forward to 2nd key ..
    i=2;
    status = fdb_iterator_seek(iterator, doc[i]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // iterator should be able to proceed forward
    status = fdb_iterator_next(iterator);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i++;
    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek forward to the last key.
    status = fdb_iterator_seek(iterator, doc[n-1]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[n-1]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[n-1]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[n-1]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek backward to start key ..
    i = 0;
    status = fdb_iterator_seek(iterator, doc[i]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek forward to key2 ..
    status = fdb_iterator_seek(iterator, doc[2]->key, strlen(keybuf), 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i=2;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
    } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(i==10);

    // Seek backward again to a key...
    status = fdb_iterator_seek(iterator, doc[3]->key, strlen(keybuf), 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i=3;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(i==10);

    fdb_iterator_close(iterator);

    // Test fdb_iterator_seek_to_max with key range
    // create an iterator for range of doc[4] ~ doc[8]
    sprintf(keybuf, "key%d", 4); // reuse buffer for start key
    sprintf(metabuf, "key%d", 8); // reuse buffer for end_key
    status = fdb_iterator_init(db, &iterator, keybuf, strlen(keybuf),
                      metabuf, strlen(metabuf),
                      FDB_ITR_NO_DELETES);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i = 8;
    status = fdb_iterator_seek_to_max(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // test fdb_iterator_seek_to_min
    i = 4;
    status = fdb_iterator_seek_to_min(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Test fdb_iterator_seek_to_max over full range
    status = fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i = n - 1;
    status = fdb_iterator_seek_to_max(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // test fdb_iterator_seek_to_min
    i = 0;
    status = fdb_iterator_seek_to_min(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close the kvs kv1
    fdb_kvs_close(kv1);
    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("iterator seek wal only test");
}